

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalGenerator.cxx
# Opt level: O2

cmLocalGenerator * __thiscall
cmGlobalGenerator::FindLocalGenerator(cmGlobalGenerator *this,string *start_dir)

{
  __type _Var1;
  char *pcVar2;
  cmLocalGenerator *unaff_R12;
  pointer ppcVar3;
  string sd;
  allocator local_51;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  ppcVar3 = (this->LocalGenerators).
            super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  do {
    if (ppcVar3 ==
        (this->LocalGenerators).
        super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      return (cmLocalGenerator *)0x0;
    }
    pcVar2 = cmLocalGenerator::GetCurrentSourceDirectory(*ppcVar3);
    std::__cxx11::string::string((string *)&local_50,pcVar2,&local_51);
    _Var1 = std::operator==(&local_50,start_dir);
    if (_Var1) {
      unaff_R12 = *ppcVar3;
    }
    std::__cxx11::string::~string((string *)&local_50);
    ppcVar3 = ppcVar3 + 1;
  } while (!_Var1);
  return unaff_R12;
}

Assistant:

cmLocalGenerator* cmGlobalGenerator::FindLocalGenerator(
  const std::string& start_dir) const
{
  for (std::vector<cmLocalGenerator*>::const_iterator it =
         this->LocalGenerators.begin();
       it != this->LocalGenerators.end(); ++it) {
    std::string sd = (*it)->GetCurrentSourceDirectory();
    if (sd == start_dir) {
      return *it;
    }
  }
  return CM_NULLPTR;
}